

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_cleanup_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::CFGCleanupPass::Process(CFGCleanupPass *this)

{
  bool bVar1;
  Status SVar2;
  IRContext *this_00;
  anon_class_8_1_8991fb9c aStack_38;
  bool modified;
  undefined1 local_30 [8];
  ProcessFunction pfn;
  CFGCleanupPass *this_local;
  
  aStack_38.this = this;
  pfn._M_invoker = (_Invoker_type)this;
  std::function<bool(spvtools::opt::Function*)>::
  function<spvtools::opt::CFGCleanupPass::Process()::__0,void>
            ((function<bool(spvtools::opt::Function*)> *)local_30,&stack0xffffffffffffffc8);
  this_00 = Pass::context((Pass *)this);
  bVar1 = IRContext::ProcessReachableCallTree(this_00,(ProcessFunction *)local_30);
  SVar2 = SuccessWithoutChange;
  if (bVar1) {
    SVar2 = SuccessWithChange;
  }
  std::function<bool_(spvtools::opt::Function_*)>::~function
            ((function<bool_(spvtools::opt::Function_*)> *)local_30);
  return SVar2;
}

Assistant:

Pass::Status CFGCleanupPass::Process() {
  // Process all entry point functions.
  ProcessFunction pfn = [this](Function* fp) { return CFGCleanup(fp); };
  bool modified = context()->ProcessReachableCallTree(pfn);
  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}